

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O2

bool stl_reader::
     ReadStlFile_BINARY<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  pointer pfVar1;
  pointer puVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  size_t ivrt;
  long lVar7;
  float *pfVar8;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  uint numTris;
  char addData [2];
  float d [12];
  string local_430 [32];
  stringstream ss;
  ostream local_400 [376];
  char stl_header [80];
  ifstream in;
  byte abStack_218 [488];
  
  pfVar1 = (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  puVar2 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  std::ifstream::ifstream(&in,filename,_S_bin);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_400,"Couldnt open file ");
    std::operator<<(poVar5,filename);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)stl_header);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)&in,(long)stl_header);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_400,"Error while parsing binary stl header in file ");
    std::operator<<(poVar5,filename);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)d);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  numTris = 0;
  std::istream::read((char *)&in,(long)&numTris);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    this = &trisOut->m_vector;
    coordsWithIndex.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    coordsWithIndex.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    coordsWithIndex.
    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = 0;
    while( true ) {
      if (numTris <= uVar3) {
        _ss = 0.0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&solidRangesOut->m_vector,(value_type_conflict3 *)&ss);
        _ss = (float)(((ulong)((long)(trisOut->m_vector).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(trisOut->m_vector).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) / 3
                     );
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&solidRangesOut->m_vector,(value_type_conflict3 *)&ss);
        stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
                  (coordsOut,trisOut,&coordsWithIndex);
        std::
        _Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::~_Vector_base(&coordsWithIndex.
                         super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       );
        std::ifstream::~ifstream(&in);
        return true;
      }
      std::istream::read((char *)&in,(long)d);
      if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) break;
      for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
        std::vector<float,_std::allocator<float>_>::push_back
                  (&normalsOut->m_vector,(value_type_conflict *)((long)d + lVar7));
      }
      pfVar8 = d;
      for (lVar7 = 1; pfVar8 = pfVar8 + 3, lVar7 != 4; lVar7 = lVar7 + 1) {
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          *(float *)(&ss + lVar4 * 4) = pfVar8[lVar4];
        }
        std::
        vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::push_back(&coordsWithIndex,(value_type *)&ss);
      }
      _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)coordsWithIndex.
                                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) + -3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this,(value_type_conflict3 *)&ss);
      _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)coordsWithIndex.
                                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this,(value_type_conflict3 *)&ss);
      _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)coordsWithIndex.
                                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this,(value_type_conflict3 *)&ss);
      std::istream::read((char *)&in,(long)addData);
      if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar5 = std::operator<<(local_400,
                                 "Error while parsing additional triangle data in binary stl file ")
        ;
        std::operator<<(poVar5,filename);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_430);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = uVar3 + 1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_400,"Error while parsing trianlge in binary stl file ");
    std::operator<<(poVar5,filename);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_430);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar5 = std::operator<<(local_400,"Couldnt determine number of triangles in binary stl file ");
  std::operator<<(poVar5,filename);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)d);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadStlFile_BINARY(const char* filename,
                        TNumberContainer1& coordsOut,
                        TNumberContainer2& normalsOut,
                        TIndexContainer1& trisOut,
					    TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename, ios::binary);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	char stl_header[80];
	in.read(stl_header, 80);
	STL_READER_COND_THROW(!in, "Error while parsing binary stl header in file " << filename);

	unsigned int numTris = 0;
	in.read((char*)&numTris, 4);
	STL_READER_COND_THROW(!in, "Couldnt determine number of triangles in binary stl file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	for(unsigned int tri = 0; tri < numTris; ++tri){
		float d[12];
		in.read((char*)d, 12 * 4);
		STL_READER_COND_THROW(!in, "Error while parsing trianlge in binary stl file " << filename);

		for(int i = 0; i < 3; ++i)
			normalsOut.push_back (d[i]);

		for(size_t ivrt = 1; ivrt < 4; ++ivrt){
			CoordWithIndex <number_t, index_t> c;
			for(size_t i = 0; i < 3; ++i)
				c[i] = d[ivrt * 3 + i];
			c.index = static_cast<index_t>(coordsWithIndex.size());
			coordsWithIndex.push_back(c);
		}

		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));

		char addData[2];
		in.read(addData, 2);
		STL_READER_COND_THROW(!in, "Error while parsing additional triangle data in binary stl file " << filename);
	}

	solidRangesOut.push_back(0);
	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}